

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSatClp(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  uint fCnfShared;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  uint fVerbose;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  local_5c = 0;
  Extra_UtilGetoptReset();
  local_54 = 20000000;
  local_58 = 1000000;
  local_50 = 0;
  local_4c = 0;
  fCnfShared = 0;
  fVerbose = 0;
LAB_0021f65f:
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"CLZcrsvh"), iVar5 = globalUtilOptind, iVar1 == 0x76)
    {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        pcVar4 = "Empty network.\n";
      }
      else {
        if (pAVar3->ntkType == ABC_NTK_LOGIC) {
          pNtk = Abc_NtkStrash(pAVar3,0,0,0);
          pAVar3 = Abc_NtkCollapseSat(pNtk,local_5c,local_58,local_54,local_50,local_4c,fCnfShared,
                                      fVerbose);
          Abc_NtkDelete(pNtk);
LAB_0021f7d0:
          if (pAVar3 != (Abc_Ntk_t *)0x0) {
            Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
            return 0;
          }
          Abc_Print(-1,"Collapsing has failed.\n");
          return 0;
        }
        if (pAVar3->ntkType == ABC_NTK_STRASH) {
          pAVar3 = Abc_NtkCollapseSat(pAVar3,local_5c,local_58,local_54,local_50,local_4c,fCnfShared
                                      ,fVerbose);
          goto LAB_0021f7d0;
        }
        pcVar4 = "Can only collapse a logic network or an AIG.\n";
      }
      iVar5 = -1;
      goto LAB_0021f917;
    }
    if (iVar1 == 0x73) {
      fCnfShared = fCnfShared ^ 1;
      goto LAB_0021f65f;
    }
    if (iVar1 == 0x4c) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-L\" should be followed by an integer.\n";
LAB_0021f829:
        Abc_Print(-1,pcVar4);
        goto LAB_0021f833;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_58 = uVar2;
    }
    else if (iVar1 == 0x5a) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-Z\" should be followed by an integer.\n";
        goto LAB_0021f829;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_54 = uVar2;
    }
    else {
      if (iVar1 == 99) {
        local_50 = local_50 ^ 1;
        goto LAB_0021f65f;
      }
      if (iVar1 == 0x72) {
        local_4c = local_4c ^ 1;
        goto LAB_0021f65f;
      }
      if (iVar1 != 0x43) goto LAB_0021f833;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0021f829;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_5c = uVar2;
    }
    globalUtilOptind = iVar5 + 1;
    if ((int)uVar2 < 0) {
LAB_0021f833:
      iVar5 = -2;
      Abc_Print(-2,"usage: satclp [-CLZ num] [-crsvh]\n");
      Abc_Print(-2,"\t         performs SAT based collapsing\n");
      Abc_Print(-2,"\t-C num : the limit on the SOP size of one output [default = %d]\n",
                (ulong)local_5c);
      Abc_Print(-2,
                "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n",
                (ulong)local_58);
      Abc_Print(-2,"\t-Z num : the limit on the cost of the largest output [default = %d]\n",
                (ulong)local_54);
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (local_50 == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-c     : toggles using canonical ISOP computation [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (local_4c == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-r     : toggles using reverse veriable ordering [default = %s]\n",pcVar4);
      pcVar4 = "yes";
      if (fCnfShared == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-s     : toggles shared CNF computation (non-canonical only) [default = %s]\n"
                ,pcVar4);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar6);
      pcVar4 = "\t-h     : print the command usage\n";
LAB_0021f917:
      Abc_Print(iVar5,pcVar4);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandSatClp( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc), * pNtkRes;
    int nCubeLim   =        0;
    int nBTLimit   =  1000000;
    int nCostMax   = 20000000;
    int fCanon     = 0;
    int fReverse   = 0;
    int fCnfShared = 0;
    int fVerbose   = 0;
    int c;

    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "CLZcrsvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCubeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCubeLim < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nBTLimit < 0 )
                goto usage;
            break;
        case 'Z':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Z\" should be followed by an integer.\n" );
                goto usage;
            }
            nCostMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCostMax < 0 )
                goto usage;
            break;
        case 'c':
            fCanon ^= 1;
            break;
        case 'r':
            fReverse ^= 1;
            break;
        case 's':
            fCnfShared ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( !Abc_NtkIsLogic(pNtk) && !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Can only collapse a logic network or an AIG.\n" );
        return 1;
    }

    // get the new network
    if ( Abc_NtkIsStrash(pNtk) )
        pNtkRes = Abc_NtkCollapseSat( pNtk, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
    else
    {
        pNtk = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pNtkRes = Abc_NtkCollapseSat( pNtk, nCubeLim, nBTLimit, nCostMax, fCanon, fReverse, fCnfShared, fVerbose );
        Abc_NtkDelete( pNtk );
    }
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Collapsing has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: satclp [-CLZ num] [-crsvh]\n" );
    Abc_Print( -2, "\t         performs SAT based collapsing\n" );
    Abc_Print( -2, "\t-C num : the limit on the SOP size of one output [default = %d]\n",              nCubeLim );
    Abc_Print( -2, "\t-L num : the limit on the number of conflicts in one SAT call [default = %d]\n", nBTLimit );
    Abc_Print( -2, "\t-Z num : the limit on the cost of the largest output [default = %d]\n",          nCostMax );
    Abc_Print( -2, "\t-c     : toggles using canonical ISOP computation [default = %s]\n",             fCanon? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggles using reverse veriable ordering [default = %s]\n",              fReverse? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggles shared CNF computation (non-canonical only) [default = %s]\n",  fCnfShared? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",                 fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}